

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_destSize_generic
              (void *ctx,char *src,char *dst,int *srcSizePtr,int targetDstSize,tableType_t tableType
              )

{
  uint uVar1;
  int iVar2;
  char cVar3;
  BYTE *s;
  char *pcVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  int *piVar12;
  U32 hashMask;
  uint uVar13;
  uint uVar14;
  char cVar15;
  long *plVar16;
  long *plVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  BYTE *e;
  long *plVar24;
  long *plVar25;
  long lVar26;
  long *__src;
  int iVar27;
  uint uVar28;
  int *piVar29;
  U32 hashMask_1;
  U16 *hashTable_5;
  long *local_c0;
  
  uVar1 = *srcSizePtr;
  iVar27 = 0;
  if ((uVar1 < 0x7e000001 && 0 < targetDstSize) && (tableType != byU16 || (int)uVar1 < 0x1000b)) {
    iVar27 = (int)src;
    plVar17 = (long *)dst;
    __src = (long *)src;
    if (0xc < (int)uVar1) {
      *srcSizePtr = 0;
      bVar5 = tableType == byU16 | 0xc;
      bVar6 = 0x28 - bVar5;
      uVar13 = ~(-1 << bVar5);
      uVar20 = (ulong)((uint)((ulong)(*(long *)src * 0xcf1bbcdcbb) >> (bVar6 & 0x3f)) & uVar13);
      if (tableType == byU16) {
        *(undefined2 *)((long)ctx + uVar20 * 2) = 0;
      }
      else {
        *(undefined4 *)((long)ctx + uVar20 * 4) = 0;
      }
      plVar8 = (long *)(src + (long)(int)uVar1 + -0xc);
      plVar16 = (long *)(src + 1);
      uVar28 = (uint)((ulong)(*(long *)(src + 1) * 0xcf1bbcdcbb) >> (bVar6 & 0x3f)) & uVar13;
      local_c0 = (long *)dst;
      piVar12 = (int *)dst;
      do {
        uVar14 = 0x40;
        uVar20 = 1;
        while( true ) {
          plVar17 = (long *)(uVar20 + (long)plVar16);
          iVar11 = (int)plVar16;
          if (plVar8 < plVar17) {
            iVar19 = 2;
          }
          else {
            uVar20 = (ulong)uVar28;
            if (tableType == byU32) {
              uVar9 = (ulong)*(uint *)((long)ctx + uVar20 * 4);
            }
            else {
              uVar9 = (ulong)*(ushort *)((long)ctx + uVar20 * 2);
            }
            piVar12 = (int *)(src + uVar9);
            uVar28 = (uint)((ulong)(*plVar17 * 0xcf1bbcdcbb) >> (bVar6 & 0x3f)) & uVar13;
            if (tableType == byU16) {
              *(short *)((long)ctx + uVar20 * 2) = (short)(iVar11 - iVar27);
            }
            else {
              *(int *)((long)ctx + uVar20 * 4) = iVar11 - iVar27;
            }
            iVar19 = 0;
          }
          if (plVar8 < plVar17) goto LAB_0015846c;
          if (((tableType == byU16) || (plVar16 <= (long *)((long)piVar12 + 0xffffU))) &&
             (*piVar12 == (int)*plVar16)) break;
          uVar20 = (ulong)(uVar14 >> 6);
          uVar14 = uVar14 + 1;
          plVar16 = plVar17;
        }
        iVar19 = 0;
LAB_0015846c:
        plVar17 = local_c0;
        if (iVar19 == 0) {
          iVar7 = iVar11 - (int)__src;
          uVar22 = iVar7 - 0x10e;
          lVar26 = 0;
          uVar14 = uVar22;
          cVar3 = (char)plVar16 * '\x10' + (char)__src * -0x10;
          do {
            cVar15 = cVar3;
            uVar23 = uVar14;
            lVar21 = lVar26;
            piVar29 = (int *)((long)piVar12 + lVar21);
            plVar25 = (long *)((long)plVar16 + lVar21);
            if ((plVar25 <= __src) || (piVar29 <= src)) break;
            lVar26 = lVar21 + -1;
            uVar14 = uVar23 - 1;
            cVar3 = cVar15 + -0x10;
          } while (*(char *)((long)plVar16 + lVar21 + -1) == *(char *)((long)piVar12 + lVar21 + -1))
          ;
          iVar2 = (int)lVar21;
          uVar20 = (ulong)(uint)(iVar2 + (iVar11 - (int)__src));
          pcVar10 = (char *)((long)local_c0 + uVar20 + (ulong)(iVar7 + iVar2 + 0xf0) / 0xff + 1);
          iVar19 = 2;
          if (pcVar10 <= dst + (long)targetDstSize + -0xb) {
            plVar16 = (long *)((long)local_c0 + 1);
            if ((uint)(iVar7 + iVar2) < 0xf) {
              *(char *)local_c0 = cVar15;
            }
            else {
              uVar9 = (ulong)(iVar7 - 0xf) + lVar21;
              *(char *)local_c0 = -0x10;
              if (0xfe < (uint)uVar9) {
                memset(plVar16,0xff,(ulong)((iVar2 + uVar22) / 0xff + 1));
                plVar16 = (long *)((long)local_c0 + ((ulong)uVar22 + lVar21 & 0xffffffff) / 0xff + 2
                                  );
                uVar9 = (ulong)(uVar23 / 0xff + iVar2 + uVar22);
              }
              *(char *)plVar16 = (char)uVar9;
              plVar16 = (long *)((long)plVar16 + 1);
            }
            plVar17 = (long *)(uVar20 + (long)plVar16);
            plVar24 = __src;
            do {
              *plVar16 = *plVar24;
              plVar16 = plVar16 + 1;
              plVar24 = plVar24 + 1;
            } while (plVar16 < plVar17);
            iVar19 = 0;
          }
          plVar16 = plVar25;
          piVar12 = piVar29;
          if (pcVar10 <= dst + (long)targetDstSize + -0xb) {
            while( true ) {
              *(short *)plVar17 = (short)plVar25 - (short)piVar29;
              plVar24 = (long *)((long)plVar17 + 2);
              uVar14 = LZ4_count((BYTE *)((long)plVar25 + 4),(BYTE *)(piVar29 + 1),
                                 (BYTE *)(src + (long)(int)uVar1 + -5));
              uVar20 = ((long)(dst + (long)targetDstSize + -6) - (long)plVar24) * 0xff + 0xe;
              if ((char *)((long)plVar17 + ((ulong)uVar14 + 0xf0) / 0xff + 2) <=
                  dst + (long)targetDstSize + -6) {
                uVar20 = (ulong)uVar14;
              }
              if (uVar20 < 0xf) {
                *(char *)local_c0 = (char)*local_c0 + (char)uVar20;
              }
              else {
                *(char *)local_c0 = (char)*local_c0 + '\x0f';
                uVar9 = uVar20 - 0xf;
                if (0xfe < uVar9) {
                  uVar9 = (uVar20 - 0x10e) / 0xff;
                  memset(plVar24,0xff,uVar9 + 1);
                  plVar24 = (long *)((long)plVar17 + uVar9 + 3);
                  uVar9 = (uVar20 + uVar9 * -0xff) - 0x10e;
                }
                *(char *)plVar24 = (char)uVar9;
                plVar24 = (long *)((long)plVar24 + 1);
              }
              lVar26 = (long)plVar25 + uVar20;
              __src = (long *)(lVar26 + 4);
              iVar19 = 3;
              plVar16 = __src;
              plVar17 = plVar24;
              piVar12 = piVar29;
              if ((plVar8 < __src) || (dst + (long)targetDstSize + -0xc < plVar24))
              goto LAB_001587f7;
              uVar20 = (ulong)((uint)((ulong)(*(long *)(lVar26 + 2) * 0xcf1bbcdcbb) >>
                                     (bVar6 & 0x3f)) & uVar13);
              iVar11 = ((int)lVar26 + 2) - iVar27;
              if (tableType == byU16) {
                *(short *)((long)ctx + uVar20 * 2) = (short)iVar11;
              }
              else {
                *(int *)((long)ctx + uVar20 * 4) = iVar11;
              }
              uVar20 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbb) >> (bVar6 & 0x3f)) & uVar13);
              if (tableType == byU32) {
                uVar9 = (ulong)*(uint *)((long)ctx + uVar20 * 4);
              }
              else {
                uVar9 = (ulong)*(ushort *)((long)ctx + uVar20 * 2);
              }
              iVar11 = (int)__src - iVar27;
              if (tableType == byU16) {
                *(short *)((long)ctx + uVar20 * 2) = (short)iVar11;
              }
              else {
                *(int *)((long)ctx + uVar20 * 4) = iVar11;
              }
              piVar29 = (int *)(src + uVar9);
              if (((long *)((long)piVar29 + 0xffffU) < __src) || (*piVar29 != *(int *)__src)) break;
              plVar17 = (long *)((long)plVar24 + 1);
              *(char *)plVar24 = '\0';
              plVar25 = __src;
              local_c0 = plVar24;
            }
            uVar28 = (uint)((ulong)(*(long *)(lVar26 + 5) * 0xcf1bbcdcbb) >> (bVar6 & 0x3f)) &
                     uVar13;
            iVar19 = 0;
            plVar16 = (long *)(lVar26 + 5);
            piVar12 = piVar29;
          }
        }
LAB_001587f7:
        local_c0 = plVar17;
      } while (iVar19 == 0);
      if (1 < iVar19 - 2U) {
        return 0x1bbcdcbb;
      }
    }
    pcVar18 = dst + targetDstSize;
    pcVar10 = src + ((long)(int)uVar1 - (long)__src);
    if (pcVar18 < (char *)((long)plVar17 + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + 1))) {
      pcVar10 = pcVar18 + (~(ulong)plVar17 - (ulong)(pcVar18 + ~(ulong)plVar17 + 0xf0) / 0xff);
    }
    pcVar18 = (char *)((long)plVar17 + 1);
    if (pcVar10 < (char *)0xf) {
      *(char *)plVar17 = (char)pcVar10 << 4;
    }
    else {
      pcVar4 = pcVar10 + -0xf;
      *(char *)plVar17 = -0x10;
      if ((char *)0xfe < pcVar4) {
        uVar20 = (ulong)(pcVar10 + -0x10e) / 0xff;
        memset(pcVar18,0xff,uVar20 + 1);
        pcVar18 = (char *)((long)plVar17 + uVar20 + 2);
        pcVar4 = pcVar10 + uVar20 * -0xff + -0x10e;
      }
      *pcVar18 = (char)pcVar4;
      pcVar18 = pcVar18 + 1;
    }
    memcpy(pcVar18,__src,(size_t)pcVar10);
    *srcSizePtr = ((int)__src + (int)pcVar10) - iVar27;
    iVar27 = ((int)pcVar18 + (int)pcVar10) - (int)dst;
  }
  return iVar27;
}

Assistant:

static int LZ4_compress_destSize_generic(
                       void* const ctx,
                 const char* const src,
                       char* const dst,
                       int*  const srcSizePtr,
                 const int targetDstSize,
                 const tableType_t tableType)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* base = (const BYTE*) src;
    const BYTE* lowLimit = (const BYTE*) src;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;

    BYTE* op = (BYTE*) dst;
    BYTE* const oend = op + targetDstSize;
    BYTE* const oMaxLit = op + targetDstSize - 2 /* offset */ - 8 /* because 8+MINMATCH==MFLIMIT */ - 1 /* token */;
    BYTE* const oMaxMatch = op + targetDstSize - (LASTLITERALS + 1 /* token */);
    BYTE* const oMaxSeq = oMaxLit - 1 /* token */;

    U32 forwardH;


    /* Init conditions */
    if (targetDstSize < 1) return 0;                                     /* Impossible to store anything */
    if ((U32)*srcSizePtr > (U32)LZ4_MAX_INPUT_SIZE) return 0;            /* Unsupported input size, too large (or negative) */
    if ((tableType == byU16) && (*srcSizePtr>=LZ4_64Klimit)) return 0;   /* Size too large (not within 64K limit) */
    if (*srcSizePtr<LZ4_minLength) goto _last_literals;                  /* Input too small, no compression (all literals) */

    /* First Byte */
    *srcSizePtr = 0;
    LZ4_putPosition(ip, ctx, tableType, base);
    ip++; forwardH = LZ4_hashPosition(ip, tableType);

    /* Main Loop */
    for ( ; ; )
    {
        const BYTE* match;
        BYTE* token;
        {
            const BYTE* forwardIp = ip;
            unsigned step = 1;
            unsigned searchMatchNb = 1 << LZ4_skipTrigger;

            /* Find a match */
            do {
                U32 h = forwardH;
                ip = forwardIp;
                forwardIp += step;
                step = (searchMatchNb++ >> LZ4_skipTrigger);

                if (unlikely(forwardIp > mflimit))
                    goto _last_literals;

                match = LZ4_getPositionOnHash(h, ctx, tableType, base);
                forwardH = LZ4_hashPosition(forwardIp, tableType);
                LZ4_putPositionOnHash(ip, h, ctx, tableType, base);

            } while ( ((tableType==byU16) ? 0 : (match + MAX_DISTANCE < ip))
                || (LZ4_read32(match) != LZ4_read32(ip)) );
        }

        /* Catch up */
        while ((ip>anchor) && (match > lowLimit) && (unlikely(ip[-1]==match[-1]))) { ip--; match--; }

        {
            /* Encode Literal length */
            unsigned litLength = (unsigned)(ip - anchor);
            token = op++;
            if (op + ((litLength+240)/255) + litLength > oMaxLit)
            {
                /* Not enough space for a last match */
                op--;
                goto _last_literals;
            }
            if (litLength>=RUN_MASK)
            {
                unsigned len = litLength - RUN_MASK;
                *token=(RUN_MASK<<ML_BITS);
                for(; len >= 255 ; len-=255) *op++ = 255;
                *op++ = (BYTE)len;
            }
            else *token = (BYTE)(litLength<<ML_BITS);

            /* Copy Literals */
            LZ4_wildCopy(op, anchor, op+litLength);
            op += litLength;
        }

_next_match:
        /* Encode Offset */
        LZ4_writeLE16(op, (U16)(ip-match)); op+=2;

        /* Encode MatchLength */
        {
            size_t matchLength;

            matchLength = LZ4_count(ip+MINMATCH, match+MINMATCH, matchlimit);

            if (op + ((matchLength+240)/255) > oMaxMatch)
            {
                /* Match description too long : reduce it */
                matchLength = (15-1) + (oMaxMatch-op) * 255;
            }
            //printf("offset %5i, matchLength%5i \n", (int)(ip-match), matchLength + MINMATCH);
            ip += MINMATCH + matchLength;

            if (matchLength>=ML_MASK)
            {
                *token += ML_MASK;
                matchLength -= ML_MASK;
                while (matchLength >= 255) { matchLength-=255; *op++ = 255; }
                *op++ = (BYTE)matchLength;
            }
            else *token += (BYTE)(matchLength);
        }

        anchor = ip;

        /* Test end of block */
        if (ip > mflimit) break;
        if (op > oMaxSeq) break;

        /* Fill table */
        LZ4_putPosition(ip-2, ctx, tableType, base);

        /* Test next position */
        match = LZ4_getPosition(ip, ctx, tableType, base);
        LZ4_putPosition(ip, ctx, tableType, base);
        if ( (match+MAX_DISTANCE>=ip)
            && (LZ4_read32(match)==LZ4_read32(ip)) )
        { token=op++; *token=0; goto _next_match; }

        /* Prepare next loop */
        forwardH = LZ4_hashPosition(++ip, tableType);
    }

_last_literals:
    /* Encode Last Literals */
    {
        size_t lastRunSize = (size_t)(iend - anchor);
        if (op + 1 /* token */ + ((lastRunSize+240)/255) /* litLength */ + lastRunSize /* literals */ > oend)
        {
            /* adapt lastRunSize to fill 'dst' */
            lastRunSize  = (oend-op) - 1;
            lastRunSize -= (lastRunSize+240)/255;
        }
        ip = anchor + lastRunSize;

        if (lastRunSize >= RUN_MASK)
        {
            size_t accumulator = lastRunSize - RUN_MASK;
            *op++ = RUN_MASK << ML_BITS;
            for(; accumulator >= 255 ; accumulator-=255) *op++ = 255;
            *op++ = (BYTE) accumulator;
        }
        else
        {
            *op++ = (BYTE)(lastRunSize<<ML_BITS);
        }
        memcpy(op, anchor, lastRunSize);
        op += lastRunSize;
    }

    /* End */
    *srcSizePtr = (int) (((const char*)ip)-src);
    return (int) (((char*)op)-dst);
}